

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,wstring *name,uint file,uint section,wstring *replacement)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined1 local_c0 [8];
  Equation equation;
  undefined4 uStack_64;
  SymbolInfo value;
  SymbolKey key;
  wstring *replacement_local;
  uint section_local;
  uint file_local;
  wstring *name_local;
  SymbolTable *this_local;
  
  replacement_local._0_4_ = section;
  replacement_local._4_4_ = file;
  _section_local = name;
  name_local = (wstring *)this;
  bVar1 = isValidSymbolName(name);
  if (bVar1) {
    bVar1 = symbolExists(this,_section_local,replacement_local._4_4_,(uint)replacement_local);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      setFileSectionValues
                (this,_section_local,(uint *)((long)&replacement_local + 4),
                 (uint *)&replacement_local);
      std::__cxx11::wstring::wstring((wstring *)&value.index,(wstring *)_section_local);
      value._0_8_ = std::vector<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>::size
                              (&this->equations);
      pmVar2 = std::
               map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
               ::operator[](&this->symbols,(key_type *)&value.index);
      *(ulong *)pmVar2 = CONCAT44(uStack_64,1);
      pmVar2->index = value._0_8_;
      std::__cxx11::wstring::wstring((wstring *)local_c0,(wstring *)_section_local);
      std::__cxx11::wstring::wstring((wstring *)&equation.field_0x18,(wstring *)replacement);
      equation._56_4_ = replacement_local._4_4_;
      equation._60_4_ = (uint)replacement_local;
      std::vector<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>::push_back
                (&this->equations,(value_type *)local_c0);
      this_local._7_1_ = 1;
      Equation::~Equation((Equation *)local_c0);
      SymbolKey::~SymbolKey((SymbolKey *)&value.index);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SymbolTable::addEquation(const std::wstring& name, unsigned int file, unsigned int section, std::wstring& replacement)
{
	if (isValidSymbolName(name) == false)
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, equations.size() };
	symbols[key] = value;

	Equation equation = { name, replacement, file, section };
	equations.push_back(equation);
	return true;
}